

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O2

int lib::table::Pack(State *state)

{
  uint uVar1;
  Table *table;
  Value *value;
  size_t sVar2;
  ulong uVar3;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  table = luna::State::NewTable(state);
  uVar1 = luna::StackAPI::GetStackSize(&api);
  sVar2 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = sVar2;
  }
  while (uVar3 != sVar2) {
    value = luna::StackAPI::GetValue(&api,(int)sVar2);
    luna::Table::SetArrayValue(table,sVar2 + 1,value);
    sVar2 = sVar2 + 1;
  }
  luna::StackAPI::PushTable(&api,table);
  return 1;
}

Assistant:

int Pack(luna::State *state)
    {
        luna::StackAPI api(state);

        auto table = state->NewTable();
        auto params = api.GetStackSize();
        for (int i = 0; i < params; ++i)
            table->SetArrayValue(i + 1, *api.GetValue(i));

        api.PushTable(table);
        return 1;
    }